

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,GeometryShaderTestInstance *this,VkQueryPool queryPool
          )

{
  VkQueryPipelineStatisticFlags VVar1;
  bool bVar2;
  VkResult result_00;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  GeometryShaderTestInstance *local_48;
  ulong local_40;
  deUint64 expected;
  deUint64 result;
  VkDevice device;
  DeviceInterface *vk;
  GeometryShaderTestInstance *this_local;
  VkQueryPool queryPool_local;
  
  vk = (DeviceInterface *)this;
  this_local = (GeometryShaderTestInstance *)queryPool.m_internal;
  queryPool_local.m_internal = (deUint64)__return_storage_ptr__;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  result = (deUint64)
           Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  expected = 0;
  local_40 = 0;
  VVar1 = ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->queryStatisticFlags;
  if (VVar1 == 8) {
    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
        VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      local_ec = 0x10;
    }
    else {
      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
          VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
        local_f0 = 8;
      }
      else {
        if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
            VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
          local_f4 = 0xf;
        }
        else {
          if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
              VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
            local_f8 = 4;
          }
          else {
            if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
              local_fc = 4;
            }
            else {
              if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                  VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) {
                local_100 = 0xe;
              }
              else {
                if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology
                    == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY) {
                  local_104 = 4;
                }
                else {
                  if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                      primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY) {
                    local_108 = 0xd;
                  }
                  else {
                    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                        primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY) {
                      local_10c = 2;
                    }
                    else {
                      local_10c = 0;
                      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                          primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY)
                      {
                        local_10c = 6;
                      }
                    }
                    local_108 = local_10c;
                  }
                  local_104 = local_108;
                }
                local_100 = local_104;
              }
              local_fc = local_100;
            }
            local_f8 = local_fc;
          }
          local_f4 = local_f8;
        }
        local_f0 = local_f4;
      }
      local_ec = local_f0;
    }
    local_40 = (ulong)local_ec;
  }
  else if (((VVar1 == 0x10) || (VVar1 == 0x20)) || (VVar1 == 0x40)) {
    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
        VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      local_110 = 0x70;
    }
    else {
      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
          VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
        local_114 = 0x20;
      }
      else {
        if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
            VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
          local_118 = 0x3c;
        }
        else {
          if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
              VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
            local_11c = 8;
          }
          else {
            if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
              local_120 = 8;
            }
            else {
              if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                  VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) {
                local_124 = 0x1c;
              }
              else {
                if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology
                    == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY) {
                  local_128 = 0x10;
                }
                else {
                  if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                      primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY) {
                    local_12c = 0x34;
                  }
                  else {
                    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                        primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY) {
                      local_130 = 4;
                    }
                    else {
                      local_130 = 0;
                      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                          primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY)
                      {
                        local_130 = 0xc;
                      }
                    }
                    local_12c = local_130;
                  }
                  local_128 = local_12c;
                }
                local_124 = local_128;
              }
              local_120 = local_124;
            }
            local_11c = local_120;
          }
          local_118 = local_11c;
        }
        local_114 = local_118;
      }
      local_110 = local_114;
    }
    local_40 = (ulong)local_110;
  }
  local_48 = this_local;
  result_00 = (**(code **)(*(long *)device + 0x100))(device,result,this_local,0,1,8,&expected,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x5ca);
  if (local_40 == expected) {
    if (((((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology !=
          VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) &&
        (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology !=
         VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)) ||
       (bVar2 = GraphicBasicTestInstance::checkImage(&this->super_GraphicBasicTestInstance), bVar2))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Pass",&local_c9);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Result image doesn\'t match expected image.",&local_a1);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"QueryPoolResults incorrect",&local_69);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GeometryShaderTestInstance::checkResult (VkQueryPool queryPool)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	deUint64				result		= 0u;
	deUint64				expected	= 0u;

	switch(m_parametersGraphic.queryStatisticFlags)
	{
		case VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT:
			expected =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						? 16u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						? 8u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						? 15u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 14u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 13u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		? 2u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	? 6u :
						0u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT:
		case VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT:
		case VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT:
			expected =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						? 112u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						? 32u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						? 60u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					? 8u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					? 8u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 28u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			? 16u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 52u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	? 12u :
						0u;
			break;
		default:
			DE_ASSERT(0);
		break;
	}
	VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
	if (expected != result)
		return tcu::TestStatus::fail("QueryPoolResults incorrect");

	if ( (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST || m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP ) && !checkImage())
		return tcu::TestStatus::fail("Result image doesn't match expected image.");

	return tcu::TestStatus::pass("Pass");
}